

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse.h
# Opt level: O3

array<unsigned_char,_8UL> mvm::num::serial_floating<double,8ul>(double val)

{
  undefined1 auVar1 [16];
  array<unsigned_char,_8UL> aVar2;
  _Type auVar3;
  uint uVar4;
  double dVar5;
  undefined8 in_XMM0_Qb;
  int local_2c;
  double local_28;
  undefined8 uStack_20;
  
  local_28 = val;
  uStack_20 = in_XMM0_Qb;
  dVar5 = frexp(val,&local_2c);
  auVar1._8_8_ = uStack_20;
  auVar1._0_8_ = local_28;
  uVar4 = movmskpd((int)&local_2c,auVar1);
  dVar5 = ldexp(ABS(dVar5) + ABS(dVar5) + -1.0,0x34);
  auVar3 = (_Type)((ulong)(local_2c + 0x3feU & 0x7ff) << 0x34 |
                   ((long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5) &
                   0xfffffffffffffU | (ulong)uVar4 << 0x3f);
  aVar2._M_elems[0] = auVar3[0];
  aVar2._M_elems[1] = auVar3[1];
  aVar2._M_elems[2] = auVar3[2];
  aVar2._M_elems[3] = auVar3[3];
  aVar2._M_elems[4] = auVar3[4];
  aVar2._M_elems[5] = auVar3[5];
  aVar2._M_elems[6] = auVar3[6];
  aVar2._M_elems[7] = auVar3[7];
  return (array<unsigned_char,_8UL>)aVar2._M_elems;
}

Assistant:

auto serial_floating(double val) {
  T tval = static_cast<T>(val);

  if constexpr (N == 4 || N == 8) {
    using ieee754_type = traits::ieee754_traits<N>;
    using unsigned_type = typename ieee754_type::unsigned_type;

    int32_t exp;
    auto d_mant = std::frexp(tval, &exp);

    // exp to store
    exp = exp - 1 + ieee754_type::exp_shift; // -1 because the radix point is
                                             // shifted in frexp

    unsigned_type neg = std::signbit(tval);
    d_mant = fabs(d_mant) * 2 - 1; // again the shift is the radix point

    unsigned_type u_exp = exp;
    unsigned_type u_mant =
        static_cast<unsigned_type>(std::ldexp(d_mant, ieee754_type::mant_size));

    unsigned_type u_bytes;
    u_bytes = (u_mant & ieee754_type::mant_mask);
    u_bytes |= ((u_exp & ieee754_type::exp_mask) << ieee754_type::mant_size);
    u_bytes |=
        ((neg & 0x1) << (ieee754_type::mant_size + ieee754_type::exp_size));

    return serial_unsigned<N>(u_bytes);
  }
}